

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactAngle1.cpp
# Opt level: O0

void __thiscall OpenMD::ContactAngle1::doFrame(ContactAngle1 *this,int param_2)

{
  bool bVar1;
  double *pdVar2;
  reference pdVar3;
  vector<double,_std::allocator<double>_> *this_00;
  long in_RDI;
  RealType maxct;
  iterator ri;
  RealType ct;
  vector<double,_std::allocator<double>_> realRoots;
  Polynomial<double> poly;
  RealType k3;
  RealType k2;
  RealType z3;
  RealType z2;
  RealType k;
  RealType dz;
  RealType mass;
  Vector3d com;
  RealType mtot;
  int i;
  StuntDouble *sd;
  Polynomial<double> *in_stack_00000288;
  Vector<double,_3U> *in_stack_fffffffffffffe58;
  Vector<double,_3U> *in_stack_fffffffffffffe60;
  StuntDouble *in_stack_fffffffffffffe68;
  int exponent;
  SelectionManager *in_stack_fffffffffffffe70;
  SelectionEvaluator *in_stack_fffffffffffffe98;
  double local_160;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_158;
  double local_150;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  undefined1 local_108 [48];
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  undefined8 local_b0;
  double local_a8;
  RealType local_70;
  Vector3<double> local_68;
  double local_50;
  StuntDouble *local_18;
  
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x120));
  if (bVar1) {
    in_stack_fffffffffffffe70 = (SelectionManager *)(in_RDI + 0x38);
    SelectionEvaluator::evaluate(in_stack_fffffffffffffe98);
    SelectionManager::setSelectionSet
              (in_stack_fffffffffffffe70,(SelectionSet *)in_stack_fffffffffffffe68);
    SelectionSet::~SelectionSet((SelectionSet *)0x1252cd);
  }
  local_50 = 0.0;
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffe60,
             (Vector3<double> *)in_stack_fffffffffffffe58);
  local_18 = SelectionManager::beginSelected
                       (in_stack_fffffffffffffe70,(int *)in_stack_fffffffffffffe68);
  while (local_18 != (StuntDouble *)0x0) {
    local_70 = StuntDouble::getMass(local_18);
    local_50 = local_70 + local_50;
    StuntDouble::getPos(in_stack_fffffffffffffe68);
    OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffe68,
                      (double)in_stack_fffffffffffffe60);
    Vector<double,_3U>::operator+=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_18 = SelectionManager::nextSelected
                         (in_stack_fffffffffffffe70,(int *)in_stack_fffffffffffffe68);
  }
  Vector<double,_3U>::operator/=(in_stack_fffffffffffffe60,(double)in_stack_fffffffffffffe58);
  pdVar2 = Vector3<double>::z(&local_68);
  local_a8 = *pdVar2 - *(double *)(in_RDI + 0xd48);
  if (local_a8 < 0.0) {
    pdVar2 = Vector3<double>::z(&local_68);
    snprintf(painCave.errMsg,2000,
             "ContactAngle1: Z-center of mass of selection, %lf, was\n\tlocated below the solid reference plane, %lf\n"
             ,*pdVar2,*(undefined8 *)(in_RDI + 0xd48));
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  if (local_a8 < *(double *)(in_RDI + 0xd50) || local_a8 == *(double *)(in_RDI + 0xd50)) {
    local_b8 = pow(2.0,-1.3333333333333333);
    local_b8 = local_b8 * *(double *)(in_RDI + 0xd50);
    local_c0 = local_a8 * local_a8;
    local_c8 = local_c0 * local_a8;
    local_d0 = local_b8 * local_b8;
    local_d8 = local_d0 * local_b8;
    exponent = (int)((ulong)local_108 >> 0x20);
    Polynomial<double>::Polynomial((Polynomial<double> *)0x125580);
    local_110 = local_c8 + local_d8;
    Polynomial<double>::setCoefficient
              ((Polynomial<double> *)in_stack_fffffffffffffe70,exponent,
               in_stack_fffffffffffffe60->data_);
    local_118 = local_c8 * 8.0 + local_d8 * 8.0;
    Polynomial<double>::setCoefficient
              ((Polynomial<double> *)in_stack_fffffffffffffe70,exponent,
               in_stack_fffffffffffffe60->data_);
    local_120 = local_c8 * 24.0 + local_d8 * 18.0;
    Polynomial<double>::setCoefficient
              ((Polynomial<double> *)in_stack_fffffffffffffe70,exponent,
               in_stack_fffffffffffffe60->data_);
    local_128 = local_c8 * 32.0;
    Polynomial<double>::setCoefficient
              ((Polynomial<double> *)in_stack_fffffffffffffe70,exponent,
               in_stack_fffffffffffffe60->data_);
    local_130 = local_c8 * 16.0 + local_d8 * -27.0;
    Polynomial<double>::setCoefficient
              ((Polynomial<double> *)in_stack_fffffffffffffe70,exponent,
               in_stack_fffffffffffffe60->data_);
    Polynomial<double>::FindRealRoots(in_stack_00000288);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    __normal_iterator(&local_158);
    local_160 = -1.0;
    local_158._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe58);
    while( true ) {
      std::vector<double,_std::allocator<double>_>::end
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe58);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)in_stack_fffffffffffffe60,
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)in_stack_fffffffffffffe58);
      if (!bVar1) break;
      pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_158);
      local_150 = *pdVar3;
      if (1.0 < local_150) {
        local_150 = 1.0;
      }
      if (local_150 < -1.0) {
        local_150 = -1.0;
      }
      if (local_160 < local_150) {
        local_160 = local_150;
      }
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_158);
    }
    this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0xcf0);
    acos(local_160);
    std::vector<double,_std::allocator<double>_>::push_back
              (this_00,in_stack_fffffffffffffe58->data_);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe70);
    Polynomial<double>::~Polynomial((Polynomial<double> *)0x125835);
  }
  else {
    local_b0 = 0x4066800000000000;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60,
               in_stack_fffffffffffffe58->data_);
  }
  return;
}

Assistant:

void ContactAngle1::doFrame(int) {
    StuntDouble* sd;
    int i;

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    RealType mtot = 0.0;
    Vector3d com(V3Zero);
    RealType mass;

    for (sd = seleMan1_.beginSelected(i); sd != NULL;
         sd = seleMan1_.nextSelected(i)) {
      mass = sd->getMass();
      mtot += mass;
      com += sd->getPos() * mass;
    }

    com /= mtot;

    RealType dz = com.z() - solidZ_;

    if (dz < 0.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ContactAngle1: Z-center of mass of selection, %lf, was\n"
               "\tlocated below the solid reference plane, %lf\n",
               com.z(), solidZ_);
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (dz > dropletRadius_) {
      values_.push_back(180.0);
    } else {
      RealType k = pow(2.0, -4.0 / 3.0) * dropletRadius_;

      RealType z2 = dz * dz;
      RealType z3 = z2 * dz;
      RealType k2 = k * k;
      RealType k3 = k2 * k;

      Polynomial<RealType> poly;
      poly.setCoefficient(4, z3 + k3);
      poly.setCoefficient(3, 8.0 * z3 + 8.0 * k3);
      poly.setCoefficient(2, 24.0 * z3 + 18.0 * k3);
      poly.setCoefficient(1, 32.0 * z3);
      poly.setCoefficient(0, 16.0 * z3 - 27.0 * k3);
      vector<RealType> realRoots = poly.FindRealRoots();

      RealType ct;

      vector<RealType>::iterator ri;

      RealType maxct = -1.0;
      for (ri = realRoots.begin(); ri != realRoots.end(); ++ri) {
        ct = *ri;
        if (ct > 1.0) ct = 1.0;
        if (ct < -1.0) ct = -1.0;

        // use the largest magnitude of ct that it finds:
        if (ct > maxct) { maxct = ct; }
      }

      values_.push_back(acos(maxct) * (180.0 / Constants::PI));
    }
  }